

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> * __thiscall
RenX::Server::activePlayers
          (vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>
           *__return_storage_ptr__,Server *this,bool includeBots)

{
  _List_node_base *p_Var1;
  PlayerInfo *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::reserve
            (__return_storage_ptr__,
             (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
             _M_impl._M_node._M_size);
  p_Var1 = (_List_node_base *)&this->players;
  while (p_Var1 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->players) {
    if ((*(int *)&p_Var1[0x10]._M_prev != 3) &&
       ((includeBots || (*(char *)(p_Var1 + 0x10 + 1) == '\0')))) {
      local_30 = (PlayerInfo *)(p_Var1 + 1);
      std::vector<RenX::PlayerInfo_const*,std::allocator<RenX::PlayerInfo_const*>>::
      emplace_back<RenX::PlayerInfo_const*>
                ((vector<RenX::PlayerInfo_const*,std::allocator<RenX::PlayerInfo_const*>> *)
                 __return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const RenX::PlayerInfo*> RenX::Server::activePlayers(bool includeBots) const {
	std::vector<const RenX::PlayerInfo*> result;
	result.reserve(players.size());

	// Build list of active players
	for (auto& player : players) {
		// Filter teamless players and bots (if applicable)
		if (player.team != TeamType::None && (includeBots || !player.isBot)) {
			result.push_back(&player);
		}
	}

	return result;
}